

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# full_toc.c
# Opt level: O1

int cueify_full_toc_deserialize(cueify_full_toc *t,uint8_t *buffer,size_t size)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ushort uVar7;
  
  iVar4 = 3;
  if ((buffer != (uint8_t *)0x0 && t != (cueify_full_toc *)0x0) && (iVar4 = 6, 3 < size)) {
    uVar7 = *(ushort *)buffer << 8 | *(ushort *)buffer >> 8;
    if (((ulong)uVar7 <= size - 2) &&
       (iVar4 = 7, (uint)uVar7 * -0x45d1745d + 0x9745d174 < 0x1745d175)) {
      memset(t,0,0x106c);
      *(uint8_t *)t = buffer[2];
      *(uint8_t *)((long)t + 1) = buffer[3];
      *(undefined2 *)((long)t + 2) = 0;
      iVar4 = 0;
      if (2 < uVar7) {
        pbVar3 = buffer + 4;
        do {
          if ((pbVar3[1] & 0xf0) == 0x50) {
            pbVar3 = pbVar3 + 0xb;
          }
          else {
            bVar2 = pbVar3[3];
            uVar5 = (ulong)bVar2;
            if (uVar5 < 100) {
              lVar6 = uVar5 * 9;
              *(byte *)((long)t + lVar6 + 4) = *pbVar3;
              *(byte *)((long)t + lVar6 + 5) = pbVar3[1] >> 4;
              *(byte *)((long)t + lVar6 + 6) = pbVar3[1] & 0xf;
              *(byte *)((long)t + lVar6 + 7) = pbVar3[4];
              *(byte *)((long)t + lVar6 + 8) = pbVar3[5];
              *(byte *)((long)t + lVar6 + 9) = pbVar3[6];
              *(byte *)((long)t + lVar6 + 10) = pbVar3[8];
              *(byte *)((long)t + lVar6 + 0xb) = pbVar3[9];
              pbVar1 = pbVar3 + 10;
              pbVar3 = pbVar3 + 0xb;
              *(byte *)((long)t + lVar6 + 0xc) = *pbVar1;
            }
            else if (uVar5 == 0xa2) {
              bVar2 = *pbVar3;
              lVar6 = (ulong)bVar2 * 0x20 + (ulong)bVar2;
              *(byte *)((long)t + lVar6 + 0x38e) = bVar2;
              *(byte *)((long)t + lVar6 + 0x38f) = pbVar3[1] >> 4;
              *(byte *)((long)t + lVar6 + 0x390) = pbVar3[1] & 0xf;
              *(byte *)((long)t + lVar6 + 0x391) = pbVar3[4];
              *(byte *)((long)t + lVar6 + 0x392) = pbVar3[5];
              *(byte *)((long)t + lVar6 + 0x393) = pbVar3[6];
              *(byte *)((long)t + lVar6 + 0x394) = pbVar3[8];
              *(byte *)((long)t + lVar6 + 0x395) = pbVar3[9];
              bVar2 = pbVar3[10];
              pbVar3 = pbVar3 + 0xb;
              *(byte *)((long)t + lVar6 + 0x396) = bVar2;
              *(undefined2 *)((long)t + lVar6 + 0x38b) = *(undefined2 *)((long)t + lVar6 + 0x394);
              *(byte *)((long)t + lVar6 + 0x38d) = bVar2;
            }
            else if (bVar2 == 0xa1) {
              bVar2 = *pbVar3;
              lVar6 = (ulong)bVar2 * 0x20 + (ulong)bVar2;
              *(byte *)((long)t + lVar6 + 0x3a0) = bVar2;
              *(byte *)((long)t + lVar6 + 0x3a1) = pbVar3[1] >> 4;
              *(byte *)((long)t + lVar6 + 0x3a2) = pbVar3[1] & 0xf;
              *(byte *)((long)t + lVar6 + 0x3a3) = pbVar3[4];
              *(byte *)((long)t + lVar6 + 0x3a4) = pbVar3[5];
              *(byte *)((long)t + lVar6 + 0x3a5) = pbVar3[6];
              bVar2 = pbVar3[8];
              *(byte *)((long)t + lVar6 + 0x3a6) = bVar2;
              *(byte *)((long)t + lVar6 + 0x389) = bVar2;
              if ((*(byte *)((long)t + 3) == 0) || (*(byte *)((long)t + 3) < bVar2)) {
                *(byte *)((long)t + 3) = bVar2;
              }
              *(byte *)((long)t + lVar6 + 0x3a7) = pbVar3[9];
              pbVar1 = pbVar3 + 10;
              pbVar3 = pbVar3 + 0xb;
              *(byte *)((long)t + lVar6 + 0x3a8) = *pbVar1;
            }
            else if (bVar2 == 0xa0) {
              bVar2 = *pbVar3;
              lVar6 = (ulong)bVar2 * 0x20 + (ulong)bVar2;
              *(byte *)((long)t + lVar6 + 0x397) = bVar2;
              *(byte *)((long)t + lVar6 + 0x398) = pbVar3[1] >> 4;
              *(byte *)((long)t + lVar6 + 0x399) = pbVar3[1] & 0xf;
              *(byte *)((long)t + lVar6 + 0x39a) = pbVar3[4];
              *(byte *)((long)t + lVar6 + 0x39b) = pbVar3[5];
              *(byte *)((long)t + lVar6 + 0x39c) = pbVar3[6];
              bVar2 = pbVar3[8];
              *(byte *)((long)t + lVar6 + 0x39d) = bVar2;
              *(byte *)((long)t + lVar6 + 0x388) = bVar2;
              if (bVar2 <= (byte)(*(char *)((long)t + 2) - 1U)) {
                *(byte *)((long)t + 2) = bVar2;
              }
              bVar2 = pbVar3[9];
              *(byte *)((long)t + lVar6 + 0x39e) = bVar2;
              *(byte *)((long)t + lVar6 + 0x38a) = bVar2;
              pbVar1 = pbVar3 + 10;
              pbVar3 = pbVar3 + 0xb;
              *(byte *)((long)t + lVar6 + 0x39f) = *pbVar1;
            }
          }
          iVar4 = 0;
        } while (pbVar3 < buffer + (ulong)uVar7 + 2);
      }
    }
  }
  return iVar4;
}

Assistant:

int cueify_full_toc_deserialize(cueify_full_toc *t,
				const uint8_t * const buffer,
				size_t size) {
    cueify_full_toc_private *toc = (cueify_full_toc_private *)t;
    uint16_t toc_length;
    const uint8_t *bp;
    uint8_t offset;

    if (t == NULL || buffer == NULL) {
	return CUEIFY_ERR_BADARG;
    }
    if (size < 4) {
	return CUEIFY_ERR_TRUNCATED;
    }

    /* TOC Data Length */
    toc_length = ((buffer[0] << 8) | buffer[1]);
    if (size - 2 < toc_length) {
	return CUEIFY_ERR_TRUNCATED;
    }
    if ((toc_length - 2) % 11 != 0) {
	return CUEIFY_ERR_CORRUPTED;
    }

    memset(toc, 0, sizeof(cueify_full_toc_private));

    /* First Complete Session Number */
    toc->first_session_number = buffer[2];
    /* Last Complete Session Number */
    toc->last_session_number = buffer[3];

    toc->first_track_number = toc->last_track_number = 0;

    /* TOC Track Descriptor(s) */
    bp = buffer + 4;
    while (bp < buffer + toc_length + 2) {
	if ((bp[1] >> 4) == 0x05) {
	    /* Ignore extra ATIP/Interval data */
	    bp += 11;
	    continue;
	}
	/* Track Number */
	offset = bp[3];
	if (offset < MAX_TRACKS) {
	    /* standard track */
	    /* Session Number */
	    toc->tracks[offset].session = *bp++;
	    /* ADR */
	    toc->tracks[offset].adr = *bp >> 4;
	    /* CONTROL */
	    toc->tracks[offset].control = *bp & 0xF;
	    bp++;
	    /* TNO */
	    bp++;
	    /* POINT */
	    bp++;
	    /* Min */
	    toc->tracks[offset].atime.min = *bp++;
	    /* Sec */
	    toc->tracks[offset].atime.sec = *bp++;
	    /* Frame */
	    toc->tracks[offset].atime.frm = *bp++;
	    /* Zero */
	    bp++;
	    /* PMIN */
	    toc->tracks[offset].offset.min = *bp++;
	    /* PSEC */
	    toc->tracks[offset].offset.sec = *bp++;
	    /* PFRAME */
	    toc->tracks[offset].offset.frm = *bp++;
	} else if (offset == 0xA0) {
	    /* POINT == 0xA0 */
	    offset = *bp++;
	    /* Session Number */
	    toc->sessions[offset].pseudotracks[1].session = offset;
	    /* ADR */
	    toc->sessions[offset].pseudotracks[1].adr = *bp >> 4;
	    /* CONTROL */
	    toc->sessions[offset].pseudotracks[1].control = *bp & 0xF;
	    bp++;
	    /* TNO */
	    bp++;
	    /* POINT */
	    bp++;
	    /* Min */
	    toc->sessions[offset].pseudotracks[1].atime.min = *bp++;
	    /* Sec */
	    toc->sessions[offset].pseudotracks[1].atime.sec = *bp++;
	    /* Frame */
	    toc->sessions[offset].pseudotracks[1].atime.frm = *bp++;
	    /* Zero */
	    bp++;
	    /* PMIN == First Track Number */
	    toc->sessions[offset].pseudotracks[1].offset.min = *bp++;
	    toc->sessions[offset].first_track_number =
		toc->sessions[offset].pseudotracks[1].offset.min;
	    if (toc->first_track_number == 0 ||
		toc->sessions[offset].first_track_number <
		toc->first_track_number) {
		toc->first_track_number =
		    toc->sessions[offset].first_track_number;
	    }
	    /* PSEC == Disc Type */
	    toc->sessions[offset].pseudotracks[1].offset.sec = *bp++;
	    toc->sessions[offset].session_type =
		toc->sessions[offset].pseudotracks[1].offset.sec;
	    /* PFRAME == Reserved */
	    toc->sessions[offset].pseudotracks[1].offset.frm = *bp++;
	} else if (offset == 0xA1) {
	    /* POINT == 0xA1 */
	    offset = *bp++;
	    /* Session Number */
	    toc->sessions[offset].pseudotracks[2].session = offset;
	    /* ADR */
	    toc->sessions[offset].pseudotracks[2].adr = *bp >> 4;
	    /* CONTROL */
	    toc->sessions[offset].pseudotracks[2].control = *bp & 0xF;
	    bp++;
	    /* TNO */
	    bp++;
	    /* POINT */
	    bp++;
	    /* Min */
	    toc->sessions[offset].pseudotracks[2].atime.min = *bp++;
	    /* Sec */
	    toc->sessions[offset].pseudotracks[2].atime.sec = *bp++;
	    /* Frame */
	    toc->sessions[offset].pseudotracks[2].atime.frm = *bp++;
	    /* Zero */
	    bp++;
	    /* PMIN == Last Track Number */
	    toc->sessions[offset].pseudotracks[2].offset.min = *bp++;
	    toc->sessions[offset].last_track_number =
		toc->sessions[offset].pseudotracks[2].offset.min;
	    if (toc->last_track_number == 0 ||
		toc->sessions[offset].last_track_number >
		toc->last_track_number) {
		toc->last_track_number =
		    toc->sessions[offset].last_track_number;
	    }
	    /* PSEC == Reserved */
	    toc->sessions[offset].pseudotracks[2].offset.sec = *bp++;
	    /* PFRAME == Reserved */
	    toc->sessions[offset].pseudotracks[2].offset.frm = *bp++;
	} else if (offset == 0xA2) {
	    /* POINT == 0xA2 */
	    /* Session Number */
	    offset = *bp++;
	    /* Session Number */
	    toc->sessions[offset].pseudotracks[0].session = offset;
	    /* ADR */
	    toc->sessions[offset].pseudotracks[0].adr = *bp >> 4;
	    /* CONTROL */
	    toc->sessions[offset].pseudotracks[0].control = *bp & 0xF;
	    bp++;
	    /* TNO */
	    bp++;
	    /* POINT */
	    bp++;
	    /* Min */
	    toc->sessions[offset].pseudotracks[0].atime.min = *bp++;
	    /* Sec */
	    toc->sessions[offset].pseudotracks[0].atime.sec = *bp++;
	    /* Frame */
	    toc->sessions[offset].pseudotracks[0].atime.frm = *bp++;
	    /* Zero */
	    bp++;
	    /* PMIN */
	    toc->sessions[offset].pseudotracks[0].offset.min = *bp++;
	    /* PSEC */
	    toc->sessions[offset].pseudotracks[0].offset.sec = *bp++;
	    /* PFRAME */
	    toc->sessions[offset].pseudotracks[0].offset.frm = *bp++;
	    toc->sessions[offset].leadout =
		toc->sessions[offset].pseudotracks[0].offset;
	}
    }

    return CUEIFY_OK;
}